

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shunting_yard.cpp
# Opt level: O2

Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
infix_to_postfix(Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *__return_storage_ptr__,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *infix)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> token;
  Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *queue;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> stack;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  operators;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_100
  ;
  List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f8;
  string local_e0;
  pointer local_c0;
  pointer local_b8;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_b0;
  string local_70;
  string local_50;
  
  local_100 = __return_storage_ptr__;
  Map::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *)
      &local_b0);
  std::__cxx11::string::string((string *)&local_120,"OR",(allocator *)&local_e0);
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_120);
  *piVar4 = 0;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"AND",(allocator *)&local_e0);
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_120);
  *piVar4 = 1;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,">",(allocator *)&local_e0);
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_120);
  *piVar4 = 2;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,">=",(allocator *)&local_e0);
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_120);
  *piVar4 = 2;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"<",(allocator *)&local_e0);
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_120);
  *piVar4 = 2;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"<=",(allocator *)&local_e0);
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_120);
  *piVar4 = 2;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"=",(allocator *)&local_e0);
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_120);
  *piVar4 = 2;
  std::__cxx11::string::~string((string *)&local_120);
  local_f8._size = 0;
  local_100->_size = 0;
  local_f8._data =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  local_f8._data_back =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  local_100->_data =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  local_100->_data_back =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  pbVar5 = (infix->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (infix->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar5 == local_c0) {
      while (local_f8._size != 0) {
        List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        pop_front(&local_120,&local_f8);
        Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        push(local_100,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
      }
      List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~List
                (&local_f8);
      BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::~BPlusTree(&local_b0);
      return local_100;
    }
    local_b8 = pbVar5;
    std::__cxx11::string::string((string *)&local_120,(string *)pbVar5);
    string_util::uppercase(&local_e0,&local_120);
    bVar3 = Map::
            Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            ::contains((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        *)&local_b0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (bVar3) {
      while (local_f8._size != 0) {
        std::__cxx11::string::string((string *)&local_50,(string *)local_f8._data);
        string_util::uppercase(&local_e0,&local_50);
        piVar4 = Map::
                 Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                               *)&local_b0,&local_e0);
        iVar1 = *piVar4;
        string_util::uppercase(&local_70,&local_120);
        piVar4 = Map::
                 Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                               *)&local_b0,&local_70);
        iVar2 = *piVar4;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_50);
        if (iVar1 < iVar2) break;
        List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        pop_front(&local_e0,&local_f8);
        Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        push(local_100,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      push_front(&local_f8,&local_120);
    }
    else {
      Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
                (local_100,&local_120);
    }
    std::__cxx11::string::~string((string *)&local_120);
    pbVar5 = local_b8 + 1;
  } while( true );
}

Assistant:

Queue<std::string> infix_to_postfix(const std::vector<std::string>& infix) {
    // operator -> precedence
    Map::Map<std::string, int> operators;
    operators["OR"] = 0;
    operators["AND"] = 1;
    operators[">"] = 2;
    operators[">="] = 2;
    operators["<"] = 2;
    operators["<="] = 2;
    operators["="] = 2;

    Stack<std::string> stack;
    Queue<std::string> queue;
    for (auto token : infix) {
        if (!operators.contains(string_util::uppercase(token)))
            queue.push(token);
        else {
            while (!stack.empty() &&
                   operators[string_util::uppercase(stack.top())] >=
                       operators[string_util::uppercase(token)]) {
                queue.push(stack.pop());
            }
            stack.push(token);
        }
    }
    while (!stack.empty()) {
        queue.push(stack.pop());
    }
    #ifdef DEBUG
        std::cout << queue << '\n';
    #endif
    return queue;
}